

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O2

void __thiscall xe::TestLogParser::parse(TestLogParser *this,deUint8 *bytes,size_t numBytes)

{
  TestCaseResultPtr *this_00;
  pointer puVar1;
  int iVar2;
  deBool dVar3;
  int numBytes_00;
  TestStatusCode TVar4;
  pointer puVar5;
  char *pcVar6;
  ContainerParseError *this_01;
  Error *pEVar7;
  TestCaseResultData *pTVar8;
  SessionInfo *pSVar9;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  SessionInfo *local_58;
  SessionInfo *local_50;
  SessionInfo *local_48;
  SessionInfo *local_40;
  SessionInfo *local_38;
  
  ContainerFormatParser::feed(&this->m_containerParser,bytes,numBytes);
  this_00 = &this->m_currentCaseData;
  local_38 = (SessionInfo *)&(this->m_sessionInfo).releaseId;
  local_40 = (SessionInfo *)&(this->m_sessionInfo).targetName;
  local_48 = (SessionInfo *)&(this->m_sessionInfo).candyTargetName;
  local_50 = (SessionInfo *)&(this->m_sessionInfo).configName;
  local_58 = (SessionInfo *)&(this->m_sessionInfo).resultName;
  local_60 = &(this->m_sessionInfo).timestamp;
  do {
    switch((this->m_containerParser).m_element) {
    case CONTAINERELEMENT_INCOMPLETE:
      return;
    case CONTAINERELEMENT_END_OF_STRING:
      pTVar8 = this_00->m_ptr;
      if (pTVar8 != (TestCaseResultData *)0x0) {
        TVar4 = TESTSTATUSCODE_TERMINATED;
        pcVar6 = "Unexpected end of string";
LAB_00110487:
        TestCaseResultData::setTestResult(pTVar8,TVar4,pcVar6);
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,this_00);
      }
      goto LAB_001104d7;
    case CONTAINERELEMENT_BEGIN_SESSION:
      if (this->m_inSession == true) {
        pEVar7 = (Error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected #beginSession",&local_81);
        Error::Error(pEVar7,&local_80);
        __cxa_throw(pEVar7,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      (*this->m_handler->_vptr_TestLogHandler[2])(this->m_handler,&this->m_sessionInfo);
      this->m_inSession = true;
      break;
    case CONTAINERELEMENT_END_SESSION:
      if (this->m_inSession == false) {
        pEVar7 = (Error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected #endSession",&local_81);
        Error::Error(pEVar7,&local_80);
        __cxa_throw(pEVar7,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->m_inSession = false;
      break;
    case CONTAINERELEMENT_SESSION_INFO:
      if (this->m_inSession == true) {
        pEVar7 = (Error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected #sessionInfo",&local_81);
        Error::Error(pEVar7,&local_80);
        __cxa_throw(pEVar7,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar6 = ContainerFormatParser::getSessionInfoAttribute(&this->m_containerParser);
      ContainerFormatParser::getSessionInfoValue(&this->m_containerParser);
      dVar3 = deStringEqual(pcVar6,"releaseName");
      pSVar9 = &this->m_sessionInfo;
      if ((((dVar3 == 0) &&
           (dVar3 = deStringEqual(pcVar6,"releaseId"), pSVar9 = local_38, dVar3 == 0)) &&
          (dVar3 = deStringEqual(pcVar6,"targetName"), pSVar9 = local_40, dVar3 == 0)) &&
         (((dVar3 = deStringEqual(pcVar6,"candyTargetName"), pSVar9 = local_48, dVar3 == 0 &&
           (dVar3 = deStringEqual(pcVar6,"configName"), pSVar9 = local_50, dVar3 == 0)) &&
          (dVar3 = deStringEqual(pcVar6,"resultName"), pSVar9 = local_58, dVar3 == 0)))) {
        dVar3 = deStringEqual(pcVar6,"timestamp");
        if (dVar3 != 0) {
          std::__cxx11::string::assign((char *)local_60);
        }
      }
      else {
        std::__cxx11::string::assign((char *)pSVar9);
      }
      break;
    case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
      if (this->m_inSession == false) {
        pEVar7 = (Error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected #beginTestCaseResult",&local_81);
        Error::Error(pEVar7,&local_80);
        __cxa_throw(pEVar7,&Error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar6 = ContainerFormatParser::getTestCasePath(&this->m_containerParser);
      (*this->m_handler->_vptr_TestLogHandler[3])(&local_80,this->m_handler,pcVar6);
      de::SharedPtr<xe::TestCaseResultData>::operator=
                (this_00,(SharedPtr<xe::TestCaseResultData> *)&local_80);
      de::SharedPtr<xe::TestCaseResultData>::~SharedPtr
                ((SharedPtr<xe::TestCaseResultData> *)&local_80);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&((this->m_currentCaseData).m_ptr)->m_data,0);
      TestCaseResultData::setTestResult
                ((this->m_currentCaseData).m_ptr,TESTSTATUSCODE_RUNNING,"Running");
LAB_0011043d:
      (*this->m_handler->_vptr_TestLogHandler[4])(this->m_handler,this_00);
      break;
    case CONTAINERELEMENT_END_TEST_CASE_RESULT:
      pTVar8 = this_00->m_ptr;
      if (pTVar8 != (TestCaseResultData *)0x0) {
        TVar4 = TESTSTATUSCODE_LAST;
        pcVar6 = "";
        goto LAB_00110487;
      }
      goto LAB_001104d7;
    case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
      if (this_00->m_ptr != (TestCaseResultData *)0x0) {
        pcVar6 = ContainerFormatParser::getTerminateReason(&this->m_containerParser);
        TVar4 = getTestStatusCode(pcVar6);
        TestCaseResultData::setTestResult((this->m_currentCaseData).m_ptr,TVar4,pcVar6);
        (*this->m_handler->_vptr_TestLogHandler[5])(this->m_handler,this_00);
      }
LAB_001104d7:
      de::SharedPtr<xe::TestCaseResultData>::clear(this_00);
      break;
    case CONTAINERELEMENT_TEST_LOG_DATA:
      pTVar8 = this_00->m_ptr;
      if (pTVar8 != (TestCaseResultData *)0x0) {
        iVar2 = (int)(pTVar8->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)(pTVar8->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        numBytes_00 = ContainerFormatParser::getDataSize(&this->m_containerParser);
        TestCaseResultData::setDataSize((this->m_currentCaseData).m_ptr,numBytes_00 + iVar2);
        pTVar8 = (this->m_currentCaseData).m_ptr;
        puVar1 = (pTVar8->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (pointer)0x0;
        if (puVar1 != (pTVar8->m_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          puVar5 = puVar1;
        }
        ContainerFormatParser::getData(&this->m_containerParser,puVar5 + iVar2,numBytes_00,0);
        goto LAB_0011043d;
      }
      break;
    default:
      this_01 = (ContainerParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Unknown container element",&local_81);
      ContainerParseError::ContainerParseError(this_01,&local_80);
      __cxa_throw(this_01,&ContainerParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    ContainerFormatParser::advance(&this->m_containerParser);
  } while( true );
}

Assistant:

void TestLogParser::parse (const deUint8* bytes, size_t numBytes)
{
	m_containerParser.feed(bytes, numBytes);

	for (;;)
	{
		ContainerElement element = m_containerParser.getElement();

		if (element == CONTAINERELEMENT_INCOMPLETE)
			break;

		switch (element)
		{
			case CONTAINERELEMENT_BEGIN_SESSION:
			{
				if (m_inSession)
					throw Error("Unexpected #beginSession");

				m_handler->setSessionInfo(m_sessionInfo);
				m_inSession = true;
				break;
			}

			case CONTAINERELEMENT_END_SESSION:
			{
				if (!m_inSession)
					throw Error("Unexpected #endSession");

				m_inSession = false;
				break;
			}

			case CONTAINERELEMENT_SESSION_INFO:
			{
				if (m_inSession)
					throw Error("Unexpected #sessionInfo");

				const char*		attribute	= m_containerParser.getSessionInfoAttribute();
				const char*		value		= m_containerParser.getSessionInfoValue();

				if (deStringEqual(attribute, "releaseName"))
					m_sessionInfo.releaseName = value;
				else if (deStringEqual(attribute, "releaseId"))
					m_sessionInfo.releaseId = value;
				else if (deStringEqual(attribute, "targetName"))
					m_sessionInfo.targetName = value;
				else if (deStringEqual(attribute, "candyTargetName"))
					m_sessionInfo.candyTargetName = value;
				else if (deStringEqual(attribute, "configName"))
					m_sessionInfo.configName = value;
				else if (deStringEqual(attribute, "resultName"))
					m_sessionInfo.resultName = value;
				else if (deStringEqual(attribute, "timestamp"))
					m_sessionInfo.timestamp = value;

				// \todo [2012-06-09 pyry] What to do with unknown/duplicate attributes? Currently just ignored.
				break;
			}

			case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
			{
				if (!m_inSession)
					throw Error("Unexpected #beginTestCaseResult");

				const char* casePath = m_containerParser.getTestCasePath();
				m_currentCaseData = m_handler->startTestCaseResult(casePath);

				// Clear and set to running state.
				m_currentCaseData->setDataSize(0);
				m_currentCaseData->setTestResult(TESTSTATUSCODE_RUNNING, "Running");

				m_handler->testCaseResultUpdated(m_currentCaseData);
				break;
			}

			case CONTAINERELEMENT_END_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					// \todo [2012-06-16 pyry] Parse status code already here?
					m_currentCaseData->setTestResult(TESTSTATUSCODE_LAST, "");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
				if (m_currentCaseData)
				{
					TestStatusCode	statusCode	= TESTSTATUSCODE_CRASH;
					const char*		reason		= m_containerParser.getTerminateReason();
					try
					{
						statusCode = getTestStatusCode(reason);
					}
					catch (const xe::ParseError&)
					{
						// Could not map status code.
					}
					m_currentCaseData->setTestResult(statusCode, reason);
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_END_OF_STRING:
				if (m_currentCaseData)
				{
					// Terminate current case.
					m_currentCaseData->setTestResult(TESTSTATUSCODE_TERMINATED, "Unexpected end of string");
					m_handler->testCaseResultComplete(m_currentCaseData);
				}
				m_currentCaseData.clear();
				break;

			case CONTAINERELEMENT_TEST_LOG_DATA:
				if (m_currentCaseData)
				{
					int offset			= m_currentCaseData->getDataSize();
					int	numDataBytes	= m_containerParser.getDataSize();

					m_currentCaseData->setDataSize(offset+numDataBytes);
					m_containerParser.getData(m_currentCaseData->getData()+offset, numDataBytes, 0);

					m_handler->testCaseResultUpdated(m_currentCaseData);
				}
				break;

			default:
				throw ContainerParseError("Unknown container element");
		}

		m_containerParser.advance();
	}
}